

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O1

bool __thiscall
cmTargetLinkLibrariesCommand::HandleLibrary
          (cmTargetLinkLibrariesCommand *this,string *lib,cmTargetLinkLibraryType llt)

{
  ProcessingState PVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  cmTargetLinkLibraryType llt_00;
  bool bVar4;
  byte bVar5;
  bool bVar6;
  PolicyStatus PVar7;
  ostream *poVar8;
  size_t sVar9;
  cmGlobalGenerator *this_00;
  cmTarget *pcVar10;
  size_type sVar11;
  long *plVar12;
  cmake *this_01;
  size_type *psVar13;
  PolicyID id;
  PolicyID id_00;
  byte bVar14;
  uint uVar15;
  char *pcVar16;
  char *pcVar17;
  ulong uVar18;
  string *dc;
  _Alloc_hider _Var19;
  string libRef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ostringstream e;
  string local_218;
  undefined4 local_1f8;
  cmTargetLinkLibraryType local_1f4;
  string local_1f0;
  ulong local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [8];
  char *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Alloc_hider local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178 [4];
  ios_base local_138 [264];
  
  pcVar10 = this->Target;
  PVar1 = this->CurrentProcessingState;
  if (PVar1 != ProcessingKeywordLinkInterface && pcVar10->TargetTypeValue == INTERFACE_LIBRARY) {
    pcVar2 = (this->super_cmCommand).Makefile;
    local_1a8 = (undefined1  [8])&local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "INTERFACE library can only be used with the INTERFACE keyword of target_link_libraries"
               ,"");
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_1a8);
LAB_002fb3b1:
    if (local_1a8 != (undefined1  [8])&local_198) {
      operator_delete((void *)local_1a8,
                      CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1)
      ;
    }
    return false;
  }
  if (pcVar10->IsImportedTarget == true && PVar1 != ProcessingKeywordLinkInterface) {
    pcVar2 = (this->super_cmCommand).Makefile;
    local_1a8 = (undefined1  [8])&local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "IMPORTED library can only be used with the INTERFACE keyword of target_link_libraries"
               ,"");
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_1a8);
    goto LAB_002fb3b1;
  }
  uVar15 = PVar1 - ProcessingKeywordLinkInterface;
  local_1f4 = llt;
  cmMakefile::GetExecutionContext((cmListFileContext *)local_1a8,(this->super_cmCommand).Makefile);
  bVar4 = cmTarget::PushTLLCommandTrace(pcVar10,(uint)(4 < uVar15),(cmListFileContext *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_p != local_178) {
    operator_delete(local_188._M_p,local_178[0]._M_allocated_capacity + 1);
  }
  if (local_1a8 != (undefined1  [8])&local_198) {
    operator_delete((void *)local_1a8,
                    CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1);
  }
  if (!bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    PVar7 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0023,false);
    if (PVar7 - NEW < 3) {
      pcVar17 = "must";
      local_1d0 = 2;
      local_1f8 = 1;
LAB_002fb452:
      bVar4 = false;
    }
    else {
      if (PVar7 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1f0,(cmPolicies *)0x17,id);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1f0._M_dataplus._M_p,
                            local_1f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,
                          CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                                   local_1f0.field_2._M_local_buf[0]) + 1);
        }
        pcVar17 = "should";
        local_1f8 = 0;
        local_1d0 = 0;
        goto LAB_002fb452;
      }
      local_1d0 = 0;
      bVar4 = true;
      local_1f8 = 0;
      pcVar17 = (char *)0x0;
    }
    if (!bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"The ",4);
      pcVar16 = "keyword";
      if (4 >= uVar15) {
        pcVar16 = "plain";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,pcVar16,(ulong)(4 < uVar15) * 2 + 5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 " signature for target_link_libraries has already been used with the target \"",
                 0x4c);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(this->Target->Name)._M_dataplus._M_p,
                          (this->Target->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"\".  All uses of target_link_libraries with a target ",0x34);
      sVar9 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar17,sVar9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8," be either all-keyword or all-plain.\n",0x25);
      cmTarget::GetTllSignatureTraces(this->Target,(ostream *)local_1a8,(uint)(uVar15 < 5));
      pcVar2 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar2,(MessageType)local_1d0,&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                                 local_1f0.field_2._M_local_buf[0]) + 1);
      }
      if ((char)local_1f8 != '\0') {
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        return false;
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  pcVar2 = (this->super_cmCommand).Makefile;
  if (pcVar2 == this->Target->Makefile) {
    uVar18 = 0;
    bVar14 = 0;
    bVar5 = 0;
  }
  else {
    uVar18 = 0;
    PVar7 = cmMakefile::GetPolicyStatus(pcVar2,CMP0079,false);
    bVar14 = 0;
    bVar5 = 0;
    if (PVar7 < (REQUIRED_ALWAYS|WARN)) {
      bVar5 = (byte)PVar7;
      uVar18 = (ulong)(2 >> (bVar5 & 0x1f));
      bVar14 = 3 >> (bVar5 & 0x1f);
      bVar5 = 0x1c >> (bVar5 & 0x1f);
    }
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  if (((bVar5 & 1) == 0) || (bVar4 = cmsys::SystemTools::FileIsFullPath(lib), bVar4)) {
    std::__cxx11::string::_M_assign((string *)&local_1f0);
  }
  else {
    cmMakefile::GetDirectoryId((cmDirectoryId *)local_1a8,(this->super_cmCommand).Makefile);
    pcVar3 = (lib->_M_dataplus)._M_p;
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,pcVar3,pcVar3 + lib->_M_string_length);
    std::__cxx11::string::append((char *)&local_1c8);
    plVar12 = (long *)std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_1a8);
    local_1d0 = CONCAT44(local_1d0._4_4_,(int)uVar18);
    psVar13 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_218.field_2._M_allocated_capacity = *psVar13;
      local_218.field_2._8_8_ = plVar12[3];
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    }
    else {
      local_218.field_2._M_allocated_capacity = *psVar13;
      local_218._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_218._M_string_length = plVar12[1];
    *plVar12 = (long)psVar13;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    uVar18 = local_1d0 & 0xffffffff;
    if (local_1a8 != (undefined1  [8])&local_198) {
      operator_delete((void *)local_1a8,
                      CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1)
      ;
    }
  }
  if (1 < this->CurrentProcessingState - ProcessingPlainLinkInterface) {
    if ((bVar14 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Attempt to add link library \"",0x1d);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(lib->_M_dataplus)._M_p,lib->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" to target \"",0xd);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(this->Target->Name)._M_dataplus._M_p,
                          (this->Target->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"\" which is not built in this directory.\n",0x28);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"This is allowed only when policy CMP0079 is set to NEW.",0x37);
      pcVar2 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      bVar4 = false;
      goto LAB_002fbdc7;
    }
    this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    pcVar10 = cmGlobalGenerator::FindTarget(this_00,lib,false);
    if ((pcVar10 != (cmTarget *)0x0) &&
       (((UNKNOWN_LIBRARY < pcVar10->TargetTypeValue ||
         ((0x196U >> (pcVar10->TargetTypeValue & 0x1f) & 1) == 0)) &&
        (bVar4 = cmTarget::IsExecutableWithExports(pcVar10), !bVar4)))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(lib->_M_dataplus)._M_p,lib->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" of type ",10);
      pcVar17 = cmState::GetTargetTypeName(pcVar10->TargetTypeValue);
      poVar8 = std::operator<<(poVar8,pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,
                 " may not be linked into another target.  One may link only to INTERFACE, OBJECT, STATIC or SHARED libraries, or to executables with the ENABLE_EXPORTS property set."
                 ,0xa4);
      pcVar2 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    cmTarget::AddLinkLibrary(this->Target,(this->super_cmCommand).Makefile,lib,&local_1f0,local_1f4)
    ;
  }
  llt_00 = local_1f4;
  if ((uVar18 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_218,(cmPolicies *)0x4f,id_00);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\nTarget\n  ",10);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(this->Target->Name)._M_dataplus._M_p,
                        (this->Target->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "\nis not created in this directory.  For compatibility with older versions of CMake, link library\n  "
               ,99);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(lib->_M_dataplus)._M_p,lib->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "\nwill be looked up in the directory in which the target was created rather than in this calling directory."
               ,0x6a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (this->super_cmCommand).Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  pcVar10 = this->Target;
  if (this->CurrentProcessingState - ProcessingPlainPrivateInterface < 2) {
    bVar4 = true;
    if ((pcVar10->TargetTypeValue == OBJECT_LIBRARY) || (pcVar10->TargetTypeValue == STATIC_LIBRARY)
       ) {
      cmTarget::GetDebugGeneratorExpressions((string *)local_1a8,pcVar10,&local_1f0,llt_00);
      bVar6 = cmGeneratorExpression::IsValidTargetName(&local_1f0);
      if ((bVar6) ||
         (sVar11 = cmGeneratorExpression::Find(&local_1f0), sVar11 != 0xffffffffffffffff)) {
        std::operator+(&local_1c8,"$<LINK_ONLY:",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_1c8);
        psVar13 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_218.field_2._M_allocated_capacity = *psVar13;
          local_218.field_2._8_8_ = plVar12[3];
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        }
        else {
          local_218.field_2._M_allocated_capacity = *psVar13;
          local_218._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_218._M_string_length = plVar12[1];
        *plVar12 = (long)psVar13;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_1a8,(string *)&local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar10 = this->Target;
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_218,"INTERFACE_LINK_LIBRARIES","");
      cmTarget::AppendProperty(pcVar10,&local_218,(char *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if (local_1a8 != (undefined1  [8])&local_198) {
        operator_delete((void *)local_1a8,
                        CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) +
                        1);
      }
    }
  }
  else {
    local_1a8 = (undefined1  [8])&local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"INTERFACE_LINK_LIBRARIES","");
    cmTarget::GetDebugGeneratorExpressions(&local_218,this->Target,&local_1f0,llt_00);
    cmTarget::AppendProperty(pcVar10,(string *)local_1a8,local_218._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != (undefined1  [8])&local_198) {
      operator_delete((void *)local_1a8,
                      CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1)
      ;
    }
    bVar4 = true;
    if (((this->CurrentProcessingState != ProcessingLinkLibraries) &&
        (PVar7 = cmPolicies::PolicyMap::Get(&this->Target->PolicyMap,CMP0022), PVar7 < NEW)) &&
       (this->Target->TargetTypeValue != INTERFACE_LIBRARY)) {
      this_01 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
      cmake::GetDebugConfigs_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_1c8,this_01);
      sVar11 = local_1c8._M_string_length;
      local_1a8 = (undefined1  [8])&local_198;
      local_1a0 = (char *)0x0;
      local_198._M_local_buf[0] = '\0';
      if ((llt_00 < OPTIMIZED_LibraryType) &&
         (local_1c8._M_dataplus._M_p != (pointer)local_1c8._M_string_length)) {
        _Var19._M_p = local_1c8._M_dataplus._M_p;
        do {
          std::__cxx11::string::_M_replace((ulong)local_1a8,0,local_1a0,0x56f5cc);
          std::__cxx11::string::_M_append((char *)local_1a8,*(ulong *)_Var19._M_p);
          cmTarget::AppendProperty
                    (this->Target,(string *)local_1a8,local_1f0._M_dataplus._M_p,false);
          _Var19._M_p = _Var19._M_p + 0x20;
        } while (_Var19._M_p != (pointer)sVar11);
      }
      if ((local_1f4 & ~OPTIMIZED_LibraryType) == GENERAL_LibraryType) {
        pcVar10 = this->Target;
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_218,"LINK_INTERFACE_LIBRARIES","");
        cmTarget::AppendProperty(pcVar10,&local_218,local_1f0._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        if (local_1c8._M_dataplus._M_p != (pointer)local_1c8._M_string_length) {
          _Var19._M_p = local_1c8._M_dataplus._M_p;
          do {
            std::__cxx11::string::_M_replace((ulong)local_1a8,0,local_1a0,0x56f5cc);
            std::__cxx11::string::_M_append((char *)local_1a8,*(ulong *)_Var19._M_p);
            pcVar17 = cmTarget::GetProperty(this->Target,(string *)local_1a8);
            if (pcVar17 == (char *)0x0) {
              cmTarget::SetProperty(this->Target,(string *)local_1a8,"");
            }
            _Var19._M_p = _Var19._M_p + 0x20;
          } while (_Var19._M_p != (pointer)local_1c8._M_string_length);
        }
      }
      if (local_1a8 != (undefined1  [8])&local_198) {
        operator_delete((void *)local_1a8,
                        CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) +
                        1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1c8);
    }
  }
LAB_002fbdc7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,
                    CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                             local_1f0.field_2._M_local_buf[0]) + 1);
    return bVar4;
  }
  return bVar4;
}

Assistant:

bool cmTargetLinkLibrariesCommand::HandleLibrary(const std::string& lib,
                                                 cmTargetLinkLibraryType llt)
{
  if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY &&
      this->CurrentProcessingState != ProcessingKeywordLinkInterface) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "INTERFACE library can only be used with the INTERFACE keyword of "
      "target_link_libraries");
    return false;
  }
  if (this->Target->IsImported() &&
      this->CurrentProcessingState != ProcessingKeywordLinkInterface) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "IMPORTED library can only be used with the INTERFACE keyword of "
      "target_link_libraries");
    return false;
  }

  cmTarget::TLLSignature sig =
    (this->CurrentProcessingState == ProcessingPlainPrivateInterface ||
     this->CurrentProcessingState == ProcessingPlainPublicInterface ||
     this->CurrentProcessingState == ProcessingKeywordPrivateInterface ||
     this->CurrentProcessingState == ProcessingKeywordPublicInterface ||
     this->CurrentProcessingState == ProcessingKeywordLinkInterface)
    ? cmTarget::KeywordTLLSignature
    : cmTarget::PlainTLLSignature;
  if (!this->Target->PushTLLCommandTrace(
        sig, this->Makefile->GetExecutionContext())) {
    std::ostringstream e;
    const char* modal = nullptr;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0023)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0023) << "\n";
        modal = "should";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = MessageType::FATAL_ERROR;
    }

    if (modal) {
      // If the sig is a keyword form and there is a conflict, the existing
      // form must be the plain form.
      const char* existingSig =
        (sig == cmTarget::KeywordTLLSignature ? "plain" : "keyword");
      e << "The " << existingSig
        << " signature for target_link_libraries has "
           "already been used with the target \""
        << this->Target->GetName()
        << "\".  All uses of target_link_libraries with a target " << modal
        << " be either all-keyword or all-plain.\n";
      this->Target->GetTllSignatureTraces(e,
                                          sig == cmTarget::KeywordTLLSignature
                                            ? cmTarget::PlainTLLSignature
                                            : cmTarget::KeywordTLLSignature);
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  bool warnRemoteInterface = false;
  bool rejectRemoteLinking = false;
  bool encodeRemoteReference = false;
  if (this->Makefile != this->Target->GetMakefile()) {
    // The LHS target was created in another directory.
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0079)) {
      case cmPolicies::WARN:
        warnRemoteInterface = true;
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        rejectRemoteLinking = true;
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        encodeRemoteReference = true;
        break;
    }
  }

  std::string libRef;
  if (encodeRemoteReference && !cmSystemTools::FileIsFullPath(lib)) {
    // This is a library name added by a caller that is not in the
    // same directory as the target was created.  Add a suffix to
    // the name to tell ResolveLinkItem to look up the name in the
    // caller's directory.
    cmDirectoryId const dirId = this->Makefile->GetDirectoryId();
    libRef = lib + CMAKE_DIRECTORY_ID_SEP + dirId.String;
  } else {
    // This is an absolute path or a library name added by a caller
    // in the same directory as the target was created.  We can use
    // the original name directly.
    libRef = lib;
  }

  // Handle normal case where the command was called with another keyword than
  // INTERFACE / LINK_INTERFACE_LIBRARIES or none at all. (The "LINK_LIBRARIES"
  // property of the target on the LHS shall be populated.)
  if (this->CurrentProcessingState != ProcessingKeywordLinkInterface &&
      this->CurrentProcessingState != ProcessingPlainLinkInterface) {

    if (rejectRemoteLinking) {
      std::ostringstream e;
      e << "Attempt to add link library \"" << lib << "\" to target \""
        << this->Target->GetName()
        << "\" which is not built in this directory.\n"
        << "This is allowed only when policy CMP0079 is set to NEW.";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return false;
    }

    cmTarget* tgt = this->Makefile->GetGlobalGenerator()->FindTarget(lib);

    if (tgt && (tgt->GetType() != cmStateEnums::STATIC_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::SHARED_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::UNKNOWN_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::OBJECT_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::INTERFACE_LIBRARY) &&
        !tgt->IsExecutableWithExports()) {
      std::ostringstream e;
      e << "Target \"" << lib << "\" of type "
        << cmState::GetTargetTypeName(tgt->GetType())
        << " may not be linked into another target.  One may link only to "
           "INTERFACE, OBJECT, STATIC or SHARED libraries, or to executables "
           "with the ENABLE_EXPORTS property set.";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    }

    this->Target->AddLinkLibrary(*this->Makefile, lib, libRef, llt);
  }

  if (warnRemoteInterface) {
    std::ostringstream w;
    /* clang-format off */
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0079) << "\n"
      "Target\n  " << this->Target->GetName() << "\nis not created in this "
      "directory.  For compatibility with older versions of CMake, link "
      "library\n  " << lib << "\nwill be looked up in the directory in "
      "which the target was created rather than in this calling "
      "directory.";
    /* clang-format on */
    this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
  }

  // Handle (additional) case where the command was called with PRIVATE /
  // LINK_PRIVATE and stop its processing. (The "INTERFACE_LINK_LIBRARIES"
  // property of the target on the LHS shall only be populated if it is a
  // STATIC library.)
  if (this->CurrentProcessingState == ProcessingKeywordPrivateInterface ||
      this->CurrentProcessingState == ProcessingPlainPrivateInterface) {
    if (this->Target->GetType() == cmStateEnums::STATIC_LIBRARY ||
        this->Target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      std::string configLib =
        this->Target->GetDebugGeneratorExpressions(libRef, llt);
      if (cmGeneratorExpression::IsValidTargetName(libRef) ||
          cmGeneratorExpression::Find(libRef) != std::string::npos) {
        configLib = "$<LINK_ONLY:" + configLib + ">";
      }
      this->Target->AppendProperty("INTERFACE_LINK_LIBRARIES",
                                   configLib.c_str());
    }
    return true;
  }

  // Handle general case where the command was called with another keyword than
  // PRIVATE / LINK_PRIVATE or none at all. (The "INTERFACE_LINK_LIBRARIES"
  // property of the target on the LHS shall be populated.)
  this->Target->AppendProperty(
    "INTERFACE_LINK_LIBRARIES",
    this->Target->GetDebugGeneratorExpressions(libRef, llt).c_str());

  // Stop processing if called without any keyword.
  if (this->CurrentProcessingState == ProcessingLinkLibraries) {
    return true;
  }
  // Stop processing if policy CMP0022 is set to NEW.
  const cmPolicies::PolicyStatus policy22Status =
    this->Target->GetPolicyStatusCMP0022();
  if (policy22Status != cmPolicies::OLD &&
      policy22Status != cmPolicies::WARN) {
    return true;
  }
  // Stop processing if called with an INTERFACE library on the LHS.
  if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    return true;
  }

  // Handle (additional) backward-compatibility case where the command was
  // called with PUBLIC / INTERFACE / LINK_PUBLIC / LINK_INTERFACE_LIBRARIES.
  // (The policy CMP0022 is not set to NEW.)
  {
    // Get the list of configurations considered to be DEBUG.
    std::vector<std::string> debugConfigs =
      this->Makefile->GetCMakeInstance()->GetDebugConfigs();
    std::string prop;

    // Include this library in the link interface for the target.
    if (llt == DEBUG_LibraryType || llt == GENERAL_LibraryType) {
      // Put in the DEBUG configuration interfaces.
      for (std::string const& dc : debugConfigs) {
        prop = "LINK_INTERFACE_LIBRARIES_";
        prop += dc;
        this->Target->AppendProperty(prop, libRef.c_str());
      }
    }
    if (llt == OPTIMIZED_LibraryType || llt == GENERAL_LibraryType) {
      // Put in the non-DEBUG configuration interfaces.
      this->Target->AppendProperty("LINK_INTERFACE_LIBRARIES", libRef.c_str());

      // Make sure the DEBUG configuration interfaces exist so that the
      // general one will not be used as a fall-back.
      for (std::string const& dc : debugConfigs) {
        prop = "LINK_INTERFACE_LIBRARIES_";
        prop += dc;
        if (!this->Target->GetProperty(prop)) {
          this->Target->SetProperty(prop, "");
        }
      }
    }
  }
  return true;
}